

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O0

int cuddMinHammingDistRecur(DdNode *f,int *minterm,DdHashTable *table,int upperBound)

{
  double dVar1;
  uint uVar2;
  DdManager *unique;
  int iVar3;
  uint *puVar4;
  DdNode *pDVar5;
  double local_90;
  ptrint fanout;
  DdNode *temp;
  DdManager *dd;
  DdNode *res;
  DdNode *zero;
  double hE;
  double hT;
  double h;
  DdNode *Fe;
  DdNode *Ft;
  DdNode *F;
  int upperBound_local;
  DdHashTable *table_local;
  int *minterm_local;
  DdNode *f_local;
  
  unique = table->manager;
  if (upperBound == 0) {
    f_local._4_4_ = 0;
  }
  else {
    puVar4 = (uint *)((ulong)f & 0xfffffffffffffffe);
    if (*puVar4 == 0x7fffffff) {
      f_local._4_4_ = upperBound;
      if ((f != unique->background) && (f != (DdNode *)((ulong)unique->one ^ 1))) {
        f_local._4_4_ = 0;
      }
    }
    else {
      pDVar5 = cuddHashTableLookup1(table,f);
      if (pDVar5 == (DdNode *)0x0) {
        Fe = *(DdNode **)(puVar4 + 4);
        h = *(double *)(puVar4 + 6);
        if (((ulong)f & 1) != 0) {
          Fe = (DdNode *)((ulong)Fe ^ 1);
          h = (double)((ulong)h ^ 1);
        }
        pDVar5 = Fe;
        if (minterm[*puVar4] == 0) {
          Fe = (DdNode *)h;
          h = (double)pDVar5;
        }
        iVar3 = cuddMinHammingDistRecur(Fe,minterm,table,upperBound);
        local_90 = (double)iVar3;
        if ((local_90 != -1.0) || (NAN(local_90))) {
          if ((local_90 != 0.0) || (NAN(local_90))) {
            iVar3 = cuddMinHammingDistRecur((DdNode *)h,minterm,table,upperBound + -1);
            zero = (DdNode *)(double)iVar3;
            if (((double)zero == -1.0) && (!NAN((double)zero))) {
              return -1;
            }
          }
          else {
            zero = (DdNode *)(double)upperBound;
          }
          if ((double)zero + 1.0 < local_90) {
            local_90 = (double)zero + 1.0;
          }
          if (puVar4[1] != 1) {
            uVar2 = puVar4[1];
            pDVar5 = cuddUniqueConst(unique,local_90);
            iVar3 = cuddHashTableInsert1(table,f,pDVar5,(ulong)uVar2 - 1);
            if (iVar3 == 0) {
              *(int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4) + 1;
              Cudd_RecursiveDeref(unique,pDVar5);
              return -1;
            }
          }
          f_local._4_4_ = (int)local_90;
        }
        else {
          f_local._4_4_ = -1;
        }
      }
      else {
        dVar1 = (pDVar5->type).value;
        if (pDVar5->ref == 0) {
          unique->dead = unique->dead + 1;
          (unique->constants).dead = (unique->constants).dead + 1;
        }
        f_local._4_4_ = (int)dVar1;
      }
    }
  }
  return f_local._4_4_;
}

Assistant:

static int
cuddMinHammingDistRecur(
  DdNode * f,
  int *minterm,
  DdHashTable * table,
  int upperBound)
{
    DdNode      *F, *Ft, *Fe;
    double      h, hT, hE;
    DdNode      *zero, *res;
    DdManager   *dd = table->manager;

    statLine(dd);
    if (upperBound == 0) return(0);

    F = Cudd_Regular(f);

    if (cuddIsConstant(F)) {
        zero = Cudd_Not(DD_ONE(dd));
        if (f == dd->background || f == zero) {
            return(upperBound);
        } else {
            return(0);
        }
    }
    if ((res = cuddHashTableLookup1(table,f)) != NULL) {
        h = cuddV(res);
        if (res->ref == 0) {
            dd->dead++;
            dd->constants.dead++;
        }
        return((int) h);
    }

    Ft = cuddT(F); Fe = cuddE(F);
    if (Cudd_IsComplement(f)) {
        Ft = Cudd_Not(Ft); Fe = Cudd_Not(Fe);
    }
    if (minterm[F->index] == 0) {
        DdNode *temp = Ft;
        Ft = Fe; Fe = temp;
    }

    hT = cuddMinHammingDistRecur(Ft,minterm,table,upperBound);
    if (hT == CUDD_OUT_OF_MEM) return(CUDD_OUT_OF_MEM);
    if (hT == 0) {
        hE = upperBound;
    } else {
        hE = cuddMinHammingDistRecur(Fe,minterm,table,upperBound - 1);
        if (hE == CUDD_OUT_OF_MEM) return(CUDD_OUT_OF_MEM);
    }
    h = ddMin(hT, hE + 1);

    if (F->ref != 1) {
        ptrint fanout = (ptrint) F->ref;
        cuddSatDec(fanout);
        res = cuddUniqueConst(dd, (CUDD_VALUE_TYPE) h);
        if (!cuddHashTableInsert1(table,f,res,fanout)) {
            cuddRef(res); Cudd_RecursiveDeref(dd, res);
            return(CUDD_OUT_OF_MEM);
        }
    }

    return((int) h);

}